

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<kj::Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_> *
kj::parse::
Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_','>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>
::Impl<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::
apply(Maybe<kj::Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_> *__return_storage_ptr__,
     Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>
     *subParser,ParserInput *input)

{
  bool bVar1;
  NullableValue<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *other;
  Array<capnp::Orphan<capnp::compiler::Token>_> *pAVar2;
  Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> local_e0;
  int local_c4;
  Array<capnp::Orphan<capnp::compiler::Token>_> *local_c0;
  Array<capnp::Orphan<capnp::compiler::Token>_> *subResult;
  undefined1 local_98 [8];
  NullableValue<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> _subResult425;
  undefined1 local_68 [8];
  ParserInput subInput;
  Results results;
  ParserInput *input_local;
  Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>
  *subParser_local;
  
  Vector<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::Vector
            ((Vector<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)&subInput.begin);
  do {
    bVar1 = IteratorInput<char,_const_char_*>::atEnd
                      (&input->super_IteratorInput<char,_const_char_*>);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ::capnp::compiler::Lexer::ParserInput::ParserInput((ParserInput *)local_68,input);
    Sequence_<kj::parse::ExactlyConst_<char,_','>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>
    ::operator()<capnp::compiler::Lexer::ParserInput>
              ((Maybe<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)&subResult,subParser,
               (ParserInput *)local_68);
    other = kj::_::readMaybe<kj::Array<capnp::Orphan<capnp::compiler::Token>>>
                      ((Maybe<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)&subResult);
    kj::_::NullableValue<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::NullableValue
              ((NullableValue<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)local_98,other);
    Maybe<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::~Maybe
              ((Maybe<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)&subResult);
    pAVar2 = kj::_::NullableValue::operator_cast_to_Array_((NullableValue *)local_98);
    if (pAVar2 == (Array<capnp::Orphan<capnp::compiler::Token>_> *)0x0) {
      local_c4 = 3;
    }
    else {
      local_c0 = kj::_::NullableValue<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::operator*
                           ((NullableValue<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)
                            local_98);
      IteratorInput<char,_const_char_*>::advanceParent
                ((IteratorInput<char,_const_char_*> *)local_68);
      pAVar2 = mv<kj::Array<capnp::Orphan<capnp::compiler::Token>>>(local_c0);
      Vector<kj::Array<capnp::Orphan<capnp::compiler::Token>>>::
      add<kj::Array<capnp::Orphan<capnp::compiler::Token>>>
                ((Vector<kj::Array<capnp::Orphan<capnp::compiler::Token>>> *)&subInput.begin,pAVar2)
      ;
      local_c4 = 0;
    }
    kj::_::NullableValue<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::~NullableValue
              ((NullableValue<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)local_98);
    if (local_c4 == 0) {
      local_c4 = 0;
    }
    ::capnp::compiler::Lexer::ParserInput::~ParserInput((ParserInput *)local_68);
  } while (local_c4 == 0);
  Vector<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::releaseAsArray
            (&local_e0,(Vector<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)&subInput.begin
            );
  Maybe<kj::Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_>::Maybe
            (__return_storage_ptr__,&local_e0);
  Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::~Array(&local_e0);
  local_c4 = 1;
  Vector<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::~Vector
            ((Vector<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)&subInput.begin);
  return __return_storage_ptr__;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_SOME(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(subResult));
      } else {
        break;
      }
    }